

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retDelay.c
# Opt level: O0

int Abc_NtkRetimeTiming_rec(Abc_Obj_t *pObj,int fForward)

{
  uint uVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  int local_34;
  int LevelMax;
  int LevelCur;
  int i;
  Abc_Obj_t *pNext;
  int fForward_local;
  Abc_Obj_t *pObj_local;
  
  local_34 = 0;
  iVar2 = Abc_NodeIsTravIdCurrent(pObj);
  if (iVar2 == 0) {
    Abc_NodeSetTravIdCurrent(pObj);
    if (fForward == 0) {
      for (LevelMax = 0; iVar2 = Abc_ObjFaninNum(pObj), LevelMax < iVar2; LevelMax = LevelMax + 1) {
        pAVar3 = Abc_ObjFanin(pObj,LevelMax);
        iVar2 = Abc_NtkRetimeTiming_rec(pAVar3,0);
        if (local_34 < iVar2) {
          local_34 = iVar2;
        }
      }
    }
    else {
      for (LevelMax = 0; iVar2 = Abc_ObjFanoutNum(pObj), LevelMax < iVar2; LevelMax = LevelMax + 1)
      {
        pAVar3 = Abc_ObjFanout(pObj,LevelMax);
        iVar2 = Abc_NtkRetimeTiming_rec(pAVar3,fForward);
        if (local_34 < iVar2) {
          local_34 = iVar2;
        }
      }
    }
    *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xfff | (local_34 + 1) * 0x1000;
    uVar1 = *(uint *)&pObj->field_0x14;
  }
  else {
    uVar1 = *(uint *)&pObj->field_0x14;
  }
  pObj_local._4_4_ = uVar1 >> 0xc;
  return pObj_local._4_4_;
}

Assistant:

int Abc_NtkRetimeTiming_rec( Abc_Obj_t * pObj, int fForward )
{
    Abc_Obj_t * pNext;
    int i, LevelCur, LevelMax = 0;
    // skip visited nodes
    if ( Abc_NodeIsTravIdCurrent(pObj) )
        return pObj->Level;
    Abc_NodeSetTravIdCurrent(pObj);
    // visit the next nodes
    if ( fForward )
    {
        Abc_ObjForEachFanout( pObj, pNext, i )
        {
            LevelCur = Abc_NtkRetimeTiming_rec( pNext, fForward );
            if ( LevelMax < LevelCur )
                LevelMax = LevelCur;
        }
    }
    else
    {
        Abc_ObjForEachFanin( pObj, pNext, i )
        {
            LevelCur = Abc_NtkRetimeTiming_rec( pNext, fForward );
            if ( LevelMax < LevelCur )
                LevelMax = LevelCur;
        }
    }
//    printf( "Node %3d -> Level %3d.\n", pObj->Id, LevelMax + 1 );
    pObj->Level = LevelMax + 1;
    return pObj->Level;
}